

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMesh.c
# Opt level: O2

int Bmc_MeshAddOneHotness(satoko_t *pSat,int iFirst,int iLast)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  char *__assertion;
  ulong uVar5;
  uint uVar6;
  int *piVar7;
  int pLits [2];
  int pVars [100];
  
  if ((iFirst < iLast) && (iLast < iFirst + 0x6e)) {
    uVar6 = 0;
    do {
      if (iLast <= iFirst) {
        iVar1 = 0;
        if (1 < (int)uVar6) {
          iVar4 = 1;
          piVar7 = pVars;
          iVar1 = 0;
          uVar5 = 0;
          while (piVar7 = piVar7 + 1, uVar5 != uVar6) {
            for (lVar3 = 0; (int)lVar3 + iVar4 < (int)uVar6; lVar3 = lVar3 + 1) {
              pLits[0] = Abc_Var2Lit(pVars[uVar5],1);
              pLits[1] = Abc_Var2Lit(piVar7[lVar3],1);
              iVar2 = satoko_add_clause(pSat,pLits,2);
              if (iVar2 == 0) {
                __assertion = "RetValue";
                uVar6 = 0x59;
                goto LAB_0048899b;
              }
            }
            iVar4 = iVar4 + 1;
            iVar1 = iVar1 + (int)lVar3;
            uVar5 = uVar5 + 1;
          }
        }
        return iVar1;
      }
      iVar1 = Bmc_MeshVarValue(pSat,iFirst);
      if (iVar1 != 0) {
        if (99 < (int)uVar6) {
          __assertion = "nVars < 100";
          uVar6 = 0x4e;
          goto LAB_0048899b;
        }
        lVar3 = (long)(int)uVar6;
        uVar6 = uVar6 + 1;
        pVars[lVar3] = iFirst;
      }
      iFirst = iFirst + 1;
    } while( true );
  }
  __assertion = "iFirst < iLast && iFirst + 110 > iLast";
  uVar6 = 0x4a;
LAB_0048899b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                ,uVar6,"int Bmc_MeshAddOneHotness(satoko_t *, int, int)");
}

Assistant:

int Bmc_MeshAddOneHotness( satoko_t * pSat, int iFirst, int iLast )
{
    int i, j, v, pVars[100], nVars  = 0, nCount = 0;
    assert( iFirst < iLast && iFirst + 110 > iLast );
    for ( v = iFirst; v < iLast; v++ )
        if ( Bmc_MeshVarValue(pSat, v) ) // v = 1
        {
            assert( nVars < 100 );
            pVars[ nVars++ ] = v;
        }
    if ( nVars <= 1 )
        return 0;
    for ( i = 0;   i < nVars; i++ )
    for ( j = i+1; j < nVars; j++ )
    {
        int pLits[2], RetValue;
        pLits[0] = Abc_Var2Lit( pVars[i], 1 );
        pLits[1] = Abc_Var2Lit( pVars[j], 1 );
        RetValue = satoko_add_clause( pSat, pLits, 2 );  assert( RetValue );
        nCount++;
    }
    return nCount;
}